

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_write_add_filter_xz.c
# Opt level: O0

int drive_compressor(archive_write_filter *f,private_data_conflict8 *data,int finishing,void *src,
                    size_t length)

{
  archive *a;
  int iVar1;
  uint uVar2;
  char *pcVar3;
  size_t local_70;
  int ret_1;
  size_t zstdret;
  undefined1 auStack_50 [4];
  int ret;
  ZSTD_inBuffer in;
  size_t length_local;
  void *src_local;
  int finishing_local;
  private_data_conflict8 *data_local;
  archive_write_filter *f_local;
  
  in.size = 0;
  _auStack_50 = src;
  in.src = (void *)length;
  in.pos = length;
  while( true ) {
    if ((data->out).pos == (data->out).size) {
      iVar1 = __archive_write_filter(f->next_filter,(data->out).dst,(data->out).size);
      if (iVar1 != 0) {
        return -0x1e;
      }
      (data->out).pos = 0;
    }
    if ((finishing == 0) && ((void *)in.size == in.src)) break;
    if (finishing == 0) {
      local_70 = ZSTD_compressStream(data->cstream,&data->out,(ZSTD_inBuffer *)auStack_50);
    }
    else {
      local_70 = ZSTD_endStream(data->cstream,&data->out);
    }
    uVar2 = ZSTD_isError(local_70);
    if (uVar2 != 0) {
      a = f->archive;
      pcVar3 = ZSTD_getErrorName(local_70);
      archive_set_error(a,-1,"Zstd compression failed: %s",pcVar3);
      return -0x1e;
    }
    if ((finishing != 0) && (local_70 == 0)) {
      iVar1 = __archive_write_filter(f->next_filter,(data->out).dst,(data->out).pos);
      return iVar1;
    }
  }
  return 0;
}

Assistant:

static int
drive_compressor(struct archive_write_filter *f,
    struct private_data *data, int finishing)
{
	int ret;

	for (;;) {
		if (data->stream.avail_out == 0) {
			data->total_out += data->compressed_buffer_size;
			ret = __archive_write_filter(f->next_filter,
			    data->compressed,
			    data->compressed_buffer_size);
			if (ret != ARCHIVE_OK)
				return (ARCHIVE_FATAL);
			data->stream.next_out = data->compressed;
			data->stream.avail_out = data->compressed_buffer_size;
		}

		/* If there's nothing to do, we're done. */
		if (!finishing && data->stream.avail_in == 0)
			return (ARCHIVE_OK);

		ret = lzma_code(&(data->stream),
		    finishing ? LZMA_FINISH : LZMA_RUN );

		switch (ret) {
		case LZMA_OK:
			/* In non-finishing case, check if compressor
			 * consumed everything */
			if (!finishing && data->stream.avail_in == 0)
				return (ARCHIVE_OK);
			/* In finishing case, this return always means
			 * there's more work */
			break;
		case LZMA_STREAM_END:
			/* This return can only occur in finishing case. */
			if (finishing)
				return (ARCHIVE_OK);
			archive_set_error(f->archive, ARCHIVE_ERRNO_MISC,
			    "lzma compression data error");
			return (ARCHIVE_FATAL);
		case LZMA_MEMLIMIT_ERROR:
			archive_set_error(f->archive, ENOMEM,
			    "lzma compression error: "
			    "%ju MiB would have been needed",
			    (uintmax_t)((lzma_memusage(&(data->stream))
				    + 1024 * 1024 -1)
				/ (1024 * 1024)));
			return (ARCHIVE_FATAL);
		default:
			/* Any other return value indicates an error. */
			archive_set_error(f->archive, ARCHIVE_ERRNO_MISC,
			    "lzma compression failed:"
			    " lzma_code() call returned status %d",
			    ret);
			return (ARCHIVE_FATAL);
		}
	}
}